

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_nodecount_unmark(MDD mdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  long lVar3;
  
  while( true ) {
    if (mdd < 2) {
      return;
    }
    puVar1 = nodes->data;
    lVar3 = mdd * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar3);
    if ((uVar2 & 1) == 0) break;
    *(ulong *)(puVar1 + lVar3) = uVar2 & 0xfffffffffffffffe;
    lddmc_nodecount_unmark(uVar2 >> 1 & 0x7fffffffffff);
    mdd = *(ulong *)(puVar1 + lVar3 + 8) >> 0x11;
  }
  return;
}

Assistant:

static void
lddmc_nodecount_unmark(MDD mdd)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) {
        mddnode_setmark(n, 0);
        lddmc_nodecount_unmark(mddnode_getright(n));
        lddmc_nodecount_unmark(mddnode_getdown(n));
    }
}